

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O1

void anon_unknown.dwarf_22b41::testTiledImage
               (Box2i *dataWindow,string *fileName,LevelMode levelMode,
               LevelRoundingMode levelRoundingMode)

{
  ostream *poVar1;
  long *plVar2;
  Rand48 random;
  DeepImage img2;
  DeepImage img1;
  Rand48 local_106;
  long *local_100 [2];
  long local_f0 [11];
  DeepImage local_98 [104];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"tiles, data window = (",0x16);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(dataWindow->min).x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(dataWindow->min).y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") - (",5);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(dataWindow->max).x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(dataWindow->max).y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"), level mode = ",0x10);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,levelMode);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", rounding mode = ",0x12);
  plVar2 = (long *)std::ostream::operator<<(poVar1,levelRoundingMode);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  Imf_3_2::DeepImage::DeepImage(local_98);
  Imf_3_2::Image::resize((Box *)local_98,(LevelMode)dataWindow,levelMode);
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"H1","");
  Imf_3_2::Image::insertChannel((string *)local_98,(PixelType)local_100,1,1,true);
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0],local_f0[0] + 1);
  }
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"H2","");
  Imf_3_2::Image::insertChannel((string *)local_98,(PixelType)local_100,1,1,true);
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0],local_f0[0] + 1);
  }
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"F","");
  Imf_3_2::Image::insertChannel((string *)local_98,(PixelType)local_100,2,1,true);
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0],local_f0[0] + 1);
  }
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"UI","");
  Imf_3_2::Image::insertChannel((string *)local_98,(PixelType)local_100,0,1,true);
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0],local_f0[0] + 1);
  }
  local_106._state[0] = 0x5a5a;
  local_106._state[1] = 0x5a5a;
  local_106._state[2] = 0x5a5a;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"    generating random pixel values",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  fillChannels(&local_106,local_98);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    saving file",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  Imf_3_2::saveDeepTiledImage((string *)fileName,local_98);
  Imf_3_2::DeepImage::DeepImage((DeepImage *)local_100);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    loading file",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  Imf_3_2::loadDeepImage((string *)fileName,(DeepImage *)local_100);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    comparing",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  verifyImagesAreEqual(local_98,(DeepImage *)local_100,0,0);
  remove((fileName->_M_dataplus)._M_p);
  Imf_3_2::DeepImage::~DeepImage((DeepImage *)local_100);
  Imf_3_2::DeepImage::~DeepImage(local_98);
  return;
}

Assistant:

void
testTiledImage (
    const Box2i&      dataWindow,
    const string&     fileName,
    LevelMode         levelMode,
    LevelRoundingMode levelRoundingMode)
{
    cout << "tiles, data window = "
            "("
         << dataWindow.min.x << ", " << dataWindow.min.y
         << ") - "
            "("
         << dataWindow.max.x << ", " << dataWindow.max.y
         << "), "
            "level mode = "
         << levelMode
         << ", "
            "rounding mode = "
         << levelRoundingMode << endl;

    FlatImage img1;
    img1.resize (dataWindow, levelMode, levelRoundingMode);

    img1.insertChannel ("H1", HALF, 1, 1, false);
    img1.insertChannel ("H2", HALF, 1, 1, true);
    img1.insertChannel ("F", FLOAT, 1, 1, false);
    img1.insertChannel ("UI", UINT, 1, 1, false);

    Rand48 random (0);
    cout << "    generating random pixel values" << endl;
    fillChannels (random, img1);

    cout << "    saving file" << endl;
    saveFlatTiledImage (fileName, img1);

    FlatImage img2;

    cout << "    loading file" << endl;
    loadFlatImage (fileName, img2);

    cout << "    comparing" << endl;
    verifyImagesAreEqual (img1, img2);

    remove (fileName.c_str ());
}